

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9VmSetByteCodeContainer(jx9_vm *pVm,SySet *pContainer)

{
  SySet *pContainer_local;
  jx9_vm *pVm_local;
  
  if (pContainer == (SySet *)0x0) {
    pVm->pByteContainer = &pVm->aByteCode;
  }
  else {
    pVm->pByteContainer = pContainer;
  }
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9VmSetByteCodeContainer(jx9_vm *pVm, SySet *pContainer)
{
	if( pContainer == 0 ){
		/* Point to the default container */
		pVm->pByteContainer = &pVm->aByteCode;
	}else{
		/* Change container */
		pVm->pByteContainer = &(*pContainer);
	}
	return SXRET_OK;
}